

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O0

QDataStream * operator>>(QDataStream *ds,QTimeZone *tz)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  undefined1 uVar5;
  bool bVar6;
  int iVar7;
  QDataStream *pQVar8;
  QDataStream *in;
  QDataStream *str;
  QDataStream *this;
  QTimeZone *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  int utcOffset_1;
  QString comment;
  int territory;
  QString abbreviation;
  QString name;
  int utcOffset;
  QString ianaId;
  QString *in_stack_fffffffffffffdd8;
  Data *other;
  QLatin1StringView *in_stack_fffffffffffffde0;
  QDataStream *in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdfc;
  QTimeZone *in_stack_fffffffffffffe08;
  undefined1 *msecs;
  undefined7 in_stack_fffffffffffffe20;
  QString *in_stack_fffffffffffffe30;
  QDataStream *in_stack_fffffffffffffe38;
  Territory territory_00;
  QString *name_00;
  int offsetSeconds;
  undefined7 in_stack_fffffffffffffe58;
  Data *this_00;
  QTimeZone *in_stack_fffffffffffffe88;
  QString *local_118;
  undefined1 local_e8 [48];
  Data local_b8;
  undefined1 *puStack_b0;
  QString *local_a8;
  undefined4 local_9c;
  undefined1 *local_98;
  undefined1 *puStack_90;
  QString *local_88;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  int local_5c;
  QLatin1StringView local_58;
  Data local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28.d = (QTimeZonePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = &local_28;
  QString::QString((QString *)0x582892);
  operator>>(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  invalidId();
  bVar3 = operator==((QString *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  QString::~QString((QString *)0x5828e1);
  if ((bVar3 & 1) == 0) {
    local_58 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffffde8,(size_t)in_stack_fffffffffffffde0);
    bVar4 = operator==((QString *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    if (bVar4) {
      local_5c = -0x55555556;
      name_00 = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      QString::QString((QString *)0x5829bc);
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
      local_88 = name_00;
      QString::QString((QString *)0x5829e5);
      local_9c = 0xaaaaaaaa;
      local_b8.d = (QTimeZonePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
      local_a8 = name_00;
      QString::QString((QString *)0x582a19);
      pQVar8 = operator>>(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      offsetSeconds = (int)((ulong)pQVar8 >> 0x20);
      pQVar8 = QDataStream::operator>>
                         (in_stack_fffffffffffffde8,(qint32 *)in_stack_fffffffffffffde0);
      in = operator>>(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      str = operator>>(in,in_stack_fffffffffffffe30);
      this = QDataStream::operator>>(in_stack_fffffffffffffde8,(qint32 *)in_stack_fffffffffffffde0);
      operator>>(in,(QString *)str);
      territory_00 = (Territory)((ulong)in >> 0x30);
      QString::toUtf8(in_stack_fffffffffffffdd8);
      QTimeZone::QTimeZone(in_stack_fffffffffffffe88,(QByteArray *)in_RDI);
      QTimeZone::operator=
                ((QTimeZone *)in_stack_fffffffffffffde0,(QTimeZone *)in_stack_fffffffffffffdd8);
      QTimeZone::~QTimeZone((QTimeZone *)0x582aff);
      QByteArray::~QByteArray((QByteArray *)0x582b0c);
      bVar2 = false;
      bVar1 = false;
      uVar5 = QTimeZone::isValid((QTimeZone *)in_stack_fffffffffffffde8);
      bVar4 = true;
      if ((bool)uVar5) {
        bVar6 = QTimeZone::hasDaylightTime(in_stack_fffffffffffffe08);
        bVar4 = true;
        if (!bVar6) {
          msecs = local_e8;
          QTimeZone::QTimeZone
                    ((QTimeZone *)in_stack_fffffffffffffde0,
                     (Initialization)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
          bVar2 = true;
          QDateTime::fromMSecsSinceEpoch((qint64)msecs,in_RSI);
          bVar1 = true;
          iVar7 = QTimeZone::offsetFromUtc
                            ((QTimeZone *)this,
                             (QDateTime *)CONCAT17(uVar5,in_stack_fffffffffffffe20));
          bVar4 = iVar7 != local_5c;
        }
      }
      if (bVar1) {
        QDateTime::~QDateTime((QDateTime *)0x582bfe);
      }
      if (bVar2) {
        QTimeZone::~QTimeZone((QTimeZone *)0x582c17);
      }
      if (bVar4) {
        QString::toUtf8(in_stack_fffffffffffffdd8);
        other = &local_b8;
        QTimeZone::QTimeZone
                  ((QTimeZone *)&this_00->s,(QByteArray *)CONCAT17(bVar3,in_stack_fffffffffffffe58),
                   offsetSeconds,name_00,(QString *)pQVar8,territory_00,local_118);
        QTimeZone::operator=((QTimeZone *)in_stack_fffffffffffffde0,(QTimeZone *)&other->s);
        QTimeZone::~QTimeZone((QTimeZone *)0x582ca2);
        QByteArray::~QByteArray((QByteArray *)0x582caf);
      }
      QString::~QString((QString *)0x582d97);
      QString::~QString((QString *)0x582da4);
      QString::~QString((QString *)0x582db1);
    }
    else {
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffffde8,(size_t)in_stack_fffffffffffffde0);
      bVar4 = operator==((QString *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if (bVar4) {
        QDataStream::operator>>(in_stack_fffffffffffffde8,(qint32 *)in_stack_fffffffffffffde0);
        QTimeZone::fromSecondsAheadOfUtc(in_stack_fffffffffffffdfc);
        QTimeZone::operator=
                  ((QTimeZone *)in_stack_fffffffffffffde0,(QTimeZone *)in_stack_fffffffffffffdd8);
        QTimeZone::~QTimeZone((QTimeZone *)0x582e78);
      }
      else {
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)in_stack_fffffffffffffde8,(size_t)in_stack_fffffffffffffde0);
        bVar4 = operator==((QString *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
        if (bVar4) {
          QTimeZone::QTimeZone
                    ((QTimeZone *)in_stack_fffffffffffffde0,
                     (Initialization)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
          QTimeZone::operator=
                    ((QTimeZone *)in_stack_fffffffffffffde0,(QTimeZone *)in_stack_fffffffffffffdd8);
          QTimeZone::~QTimeZone((QTimeZone *)0x582eed);
        }
        else {
          Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_stack_fffffffffffffde8,(size_t)in_stack_fffffffffffffde0);
          bVar4 = operator==((QString *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
          if (bVar4) {
            QTimeZone::QTimeZone
                      ((QTimeZone *)in_stack_fffffffffffffde0,
                       (Initialization)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
            QTimeZone::operator=
                      ((QTimeZone *)in_stack_fffffffffffffde0,(QTimeZone *)in_stack_fffffffffffffdd8
                      );
            QTimeZone::~QTimeZone((QTimeZone *)0x582f5f);
          }
          else {
            QString::toUtf8(in_stack_fffffffffffffdd8);
            QTimeZone::QTimeZone(in_stack_fffffffffffffe88,(QByteArray *)in_RDI);
            QTimeZone::operator=
                      ((QTimeZone *)in_stack_fffffffffffffde0,(QTimeZone *)in_stack_fffffffffffffdd8
                      );
            QTimeZone::~QTimeZone((QTimeZone *)0x582fb4);
            QByteArray::~QByteArray((QByteArray *)0x582fc1);
          }
        }
      }
    }
  }
  else {
    QTimeZone::QTimeZone((QTimeZone *)0x5828fb);
    QTimeZone::operator=
              ((QTimeZone *)in_stack_fffffffffffffde0,(QTimeZone *)in_stack_fffffffffffffdd8);
    QTimeZone::~QTimeZone((QTimeZone *)0x58291d);
  }
  QString::~QString((QString *)0x58300c);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QDataStream &operator>>(QDataStream &ds, QTimeZone &tz)
{
    QString ianaId;
    ds >> ianaId;
    // That may be various things other than actual IANA IDs:
    if (ianaId == invalidId()) {
        tz = QTimeZone();
    } else if (ianaId == "OffsetFromUtc"_L1) {
        int utcOffset;
        QString name;
        QString abbreviation;
        int territory;
        QString comment;
        ds >> ianaId >> utcOffset >> name >> abbreviation >> territory >> comment;
#if QT_CONFIG(timezone)
        // Try creating as a system timezone, which succeeds (producing a valid
        // zone) iff ianaId is valid; use this if it is a plain offset from UTC
        // zone, with the right offset, ignoring the other data:
        tz = QTimeZone(ianaId.toUtf8());
        if (!tz.isValid() || tz.hasDaylightTime()
            || tz.offsetFromUtc(QDateTime::fromMSecsSinceEpoch(0, QTimeZone::UTC)) != utcOffset) {
            // Construct a custom timezone using the saved values:
            tz = QTimeZone(ianaId.toUtf8(), utcOffset, name, abbreviation,
                           QLocale::Territory(territory), comment);
        }
#else
        tz = QTimeZone::fromSecondsAheadOfUtc(utcOffset);
#endif
    } else if (ianaId == "AheadOfUtcBy"_L1) {
        int utcOffset;
        ds >> utcOffset;
        tz = QTimeZone::fromSecondsAheadOfUtc(utcOffset);
    } else if (ianaId == "QTimeZone::UTC"_L1) {
        tz = QTimeZone(QTimeZone::UTC);
    } else if (ianaId == "QTimeZone::LocalTime"_L1) {
        tz = QTimeZone(QTimeZone::LocalTime);
#if QT_CONFIG(timezone)
    } else {
        tz = QTimeZone(ianaId.toUtf8());
#endif
    }
    return ds;
}